

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::ResizeBilinearLayerParams::ByteSizeLong(ResizeBilinearLayerParams *this)

{
  SamplingMode *pSVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  unsigned_long *puVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  size_t sVar9;
  
  uVar4 = (this->targetsize_).current_size_;
  uVar6 = 0;
  if ((int)uVar4 < 1) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    do {
      puVar5 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->targetsize_,(int)uVar6);
      lVar3 = 0x3f;
      if ((*puVar5 | 1) != 0) {
        for (; (*puVar5 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      lVar7 = lVar7 + (ulong)((int)lVar3 * 9 + 0x49U >> 6);
      uVar8 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar8;
    } while (uVar4 != uVar8);
    if (lVar7 == 0) {
      lVar7 = 0;
      uVar6 = 0;
    }
    else if ((int)(uint)lVar7 < 0) {
      uVar6 = 0xb;
    }
    else {
      uVar4 = (uint)lVar7 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar6 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
  }
  this->_targetsize_cached_byte_size_ = (int)lVar7;
  sVar9 = uVar6 + lVar7;
  pSVar1 = this->mode_;
  if (pSVar1 != (SamplingMode *)0x0 &&
      this != (ResizeBilinearLayerParams *)&_ResizeBilinearLayerParams_default_instance_) {
    uVar4 = pSVar1->samplingmethod_;
    if (uVar4 == 0) {
      uVar6 = 0;
    }
    else if ((int)uVar4 < 0) {
      uVar6 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar6 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    pSVar1->_cached_size_ = (int)uVar6;
    sVar9 = sVar9 + uVar6 + 2;
  }
  this->_cached_size_ = (int)sVar9;
  return sVar9;
}

Assistant:

size_t ResizeBilinearLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ResizeBilinearLayerParams)
  size_t total_size = 0;

  // repeated uint64 targetSize = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->targetsize_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _targetsize_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.SamplingMode mode = 2;
  if (this->has_mode()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->mode_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}